

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int CfdSerializeByteData(void *handle,char *buffer,char **output)

{
  pointer pcVar1;
  size_t sVar2;
  char *pcVar3;
  CfdException *pCVar4;
  ByteData data;
  undefined1 local_80 [32];
  ByteData local_60;
  ByteData local_48;
  
  cfd::Initialize();
  if (buffer == (char *)0x0) {
    local_80._0_8_ = "cfdcapi_common.cpp";
    local_80._8_4_ = 0x2b3;
    local_80._16_8_ = "CfdSerializeByteData";
    cfd::core::logger::log<>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"buffer is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_80._0_8_ = local_80 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_80,"Failed to parameter. buffer is null.","");
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_80);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (output != (char **)0x0) {
    pcVar1 = local_80 + 0x10;
    local_80._0_8_ = pcVar1;
    sVar2 = strlen(buffer);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_80,buffer,buffer + sVar2);
    cfd::core::ByteData::ByteData(&local_48,(string *)local_80);
    if ((pointer)local_80._0_8_ != pcVar1) {
      operator_delete((void *)local_80._0_8_);
    }
    cfd::core::ByteData::Serialize(&local_60,&local_48);
    cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_80,&local_60);
    pcVar3 = cfd::capi::CreateString((string *)local_80);
    *output = pcVar3;
    if ((pointer)local_80._0_8_ != pcVar1) {
      operator_delete((void *)local_80._0_8_);
    }
    if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_80._0_8_ = "cfdcapi_common.cpp";
  local_80._8_4_ = 0x2b9;
  local_80._16_8_ = "CfdSerializeByteData";
  cfd::core::logger::log<>((CfdSourceLocation *)local_80,kCfdLogLevelWarning,"output is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_80,"Failed to parameter. output is null.","");
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_80);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSerializeByteData(
    void* handle, const char* buffer, char** output) {
  try {
    cfd::Initialize();
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }

    ByteData data(buffer);
    *output = cfd::capi::CreateString(data.Serialize().GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}